

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_belme_gu(REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,
                   REF_DBL re,REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  REF_NODE pRVar1;
  int iVar2;
  uint uVar3;
  REF_DBL *scalar;
  REF_DBL *hessian;
  REF_DBL *grad;
  void *__ptr;
  REF_DBL *scalar_00;
  REF_DBL *hessian_00;
  REF_DBL *grad_00;
  void *__ptr_00;
  int iVar4;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  REF_DBL local_288;
  REF_DBL local_280;
  REF_DBL local_278;
  REF_DBL local_270;
  REF_DBL local_268;
  double local_260;
  double local_250;
  double local_248;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_210;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_7;
  REF_INT ref_malloc_init_i_6;
  REF_INT ref_malloc_init_i_5;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL mu_t;
  REF_DBL turb;
  REF_DBL rho;
  REF_DBL thermal_conductivity;
  REF_DBL turbulent_pr;
  REF_DBL pr;
  REF_DBL mu;
  REF_DBL t;
  REF_DBL gamma;
  REF_DBL weight;
  REF_DBL diag_system [12];
  REF_DBL w3;
  REF_DBL w2;
  REF_DBL w1;
  REF_DBL u3;
  REF_DBL u2;
  REF_DBL u1;
  REF_DBL *omega;
  REF_DBL *grad_u;
  REF_DBL *hess_u;
  REF_DBL *u;
  REF_DBL *sr_lam;
  REF_DBL *grad_lam;
  REF_DBL *hess_lam;
  REF_DBL *lam;
  int local_68;
  REF_INT nequ;
  REF_INT dir;
  REF_INT i;
  REF_INT node;
  REF_INT var;
  REF_NODE ref_node;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL reference_temp_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_DBL *prim_dual_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  t = 1.4;
  turbulent_pr = 0.72;
  thermal_conductivity = 0.9;
  iVar2 = ldim / 2;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xacc,
           "ref_metric_belme_gu","malloc lam of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xacc,"ref_metric_belme_gu","malloc lam of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < pRVar1->max;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        scalar[ref_malloc_init_i_2] = 0.0;
      }
      if (pRVar1->max * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xacd,"ref_metric_belme_gu","malloc hess_lam of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        hessian = (REF_DBL *)malloc((long)(pRVar1->max * 6) << 3);
        if (hessian == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xacd,"ref_metric_belme_gu","malloc hess_lam of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0;
              SBORROW4(ref_malloc_init_i_3,pRVar1->max * 6) !=
              ref_malloc_init_i_3 + pRVar1->max * -6 < 0;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            hessian[ref_malloc_init_i_3] = 0.0;
          }
          if (pRVar1->max * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xace,"ref_metric_belme_gu","malloc grad_lam of REF_DBL negative");
            metric_local._4_4_ = 1;
          }
          else {
            grad = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
            if (grad == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xace,"ref_metric_belme_gu","malloc grad_lam of REF_DBL NULL");
              metric_local._4_4_ = 2;
            }
            else {
              for (ref_malloc_init_i_4 = 0;
                  SBORROW4(ref_malloc_init_i_4,pRVar1->max * 3) !=
                  ref_malloc_init_i_4 + pRVar1->max * -3 < 0;
                  ref_malloc_init_i_4 = ref_malloc_init_i_4 + 1) {
                grad[ref_malloc_init_i_4] = 0.0;
              }
              if (pRVar1->max * 5 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xacf,"ref_metric_belme_gu","malloc sr_lam of REF_DBL negative");
                metric_local._4_4_ = 1;
              }
              else {
                __ptr = malloc((long)(pRVar1->max * 5) << 3);
                if (__ptr == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xacf,"ref_metric_belme_gu","malloc sr_lam of REF_DBL NULL");
                  metric_local._4_4_ = 2;
                }
                else {
                  for (ref_malloc_init_i_5 = 0;
                      SBORROW4(ref_malloc_init_i_5,pRVar1->max * 5) !=
                      ref_malloc_init_i_5 + pRVar1->max * -5 < 0;
                      ref_malloc_init_i_5 = ref_malloc_init_i_5 + 1) {
                    *(undefined8 *)((long)__ptr + (long)ref_malloc_init_i_5 * 8) = 0;
                  }
                  if (pRVar1->max < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xad0,"ref_metric_belme_gu","malloc u of REF_DBL negative");
                    metric_local._4_4_ = 1;
                  }
                  else {
                    scalar_00 = (REF_DBL *)malloc((long)pRVar1->max << 3);
                    if (scalar_00 == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xad0,"ref_metric_belme_gu","malloc u of REF_DBL NULL");
                      metric_local._4_4_ = 2;
                    }
                    else {
                      for (ref_malloc_init_i_6 = 0; ref_malloc_init_i_6 < pRVar1->max;
                          ref_malloc_init_i_6 = ref_malloc_init_i_6 + 1) {
                        scalar_00[ref_malloc_init_i_6] = 0.0;
                      }
                      if (pRVar1->max * 6 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xad1,"ref_metric_belme_gu","malloc hess_u of REF_DBL negative");
                        metric_local._4_4_ = 1;
                      }
                      else {
                        hessian_00 = (REF_DBL *)malloc((long)(pRVar1->max * 6) << 3);
                        if (hessian_00 == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0xad1,"ref_metric_belme_gu","malloc hess_u of REF_DBL NULL");
                          metric_local._4_4_ = 2;
                        }
                        else {
                          for (ref_malloc_init_i_7 = 0;
                              SBORROW4(ref_malloc_init_i_7,pRVar1->max * 6) !=
                              ref_malloc_init_i_7 + pRVar1->max * -6 < 0;
                              ref_malloc_init_i_7 = ref_malloc_init_i_7 + 1) {
                            hessian_00[ref_malloc_init_i_7] = 0.0;
                          }
                          if (pRVar1->max * 3 < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0xad2,"ref_metric_belme_gu","malloc grad_u of REF_DBL negative")
                            ;
                            metric_local._4_4_ = 1;
                          }
                          else {
                            grad_00 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
                            if (grad_00 == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0xad2,"ref_metric_belme_gu","malloc grad_u of REF_DBL NULL");
                              metric_local._4_4_ = 2;
                            }
                            else {
                              for (ref_private_macro_code_rss = 0;
                                  SBORROW4(ref_private_macro_code_rss,pRVar1->max * 3) !=
                                  ref_private_macro_code_rss + pRVar1->max * -3 < 0;
                                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                                grad_00[ref_private_macro_code_rss] = 0.0;
                              }
                              if (pRVar1->max * 9 < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0xad3,"ref_metric_belme_gu",
                                       "malloc omega of REF_DBL negative");
                                metric_local._4_4_ = 1;
                              }
                              else {
                                __ptr_00 = malloc((long)(pRVar1->max * 9) << 3);
                                if (__ptr_00 == (void *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,0xad3,"ref_metric_belme_gu","malloc omega of REF_DBL NULL"
                                        );
                                  metric_local._4_4_ = 2;
                                }
                                else {
                                  for (ref_private_macro_code_rss_1 = 0;
                                      SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 9) !=
                                      ref_private_macro_code_rss_1 + pRVar1->max * -9 < 0;
                                      ref_private_macro_code_rss_1 =
                                           ref_private_macro_code_rss_1 + 1) {
                                    *(undefined8 *)
                                     ((long)__ptr_00 + (long)ref_private_macro_code_rss_1 * 8) = 0;
                                  }
                                  for (i = 0; i < 5; i = i + 1) {
                                    for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                      if (((-1 < dir) && (dir < pRVar1->max)) &&
                                         (-1 < pRVar1->global[dir])) {
                                        scalar[dir] = prim_dual[i + iVar2 + ldim * dir];
                                      }
                                    }
                                    uVar3 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction
                                                             );
                                    if (uVar3 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                             ,0xad9,"ref_metric_belme_gu",(ulong)uVar3,"hess_lam");
                                      return uVar3;
                                    }
                                    for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                      if (((-1 < dir) && (dir < pRVar1->max)) &&
                                         (-1 < pRVar1->global[dir])) {
                                        uVar3 = ref_matrix_diag_m(hessian + dir * 6,&weight);
                                        if (uVar3 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                 ,0xadb,"ref_metric_belme_gu",(ulong)uVar3,"decomp")
                                          ;
                                          return uVar3;
                                        }
                                        if (weight <= 0.0) {
                                          local_210 = -weight;
                                        }
                                        else {
                                          local_210 = weight;
                                        }
                                        if (diag_system[0] <= 0.0) {
                                          local_220 = -diag_system[0];
                                        }
                                        else {
                                          local_220 = diag_system[0];
                                        }
                                        if (local_210 <= local_220) {
                                          if (diag_system[0] <= 0.0) {
                                            local_238 = -diag_system[0];
                                          }
                                          else {
                                            local_238 = diag_system[0];
                                          }
                                          local_230 = local_238;
                                        }
                                        else {
                                          if (weight <= 0.0) {
                                            local_228 = -weight;
                                          }
                                          else {
                                            local_228 = weight;
                                          }
                                          local_230 = local_228;
                                        }
                                        if (diag_system[1] <= 0.0) {
                                          local_248 = -diag_system[1];
                                        }
                                        else {
                                          local_248 = diag_system[1];
                                        }
                                        if (local_230 <= local_248) {
                                          if (diag_system[1] <= 0.0) {
                                            local_288 = -diag_system[1];
                                          }
                                          else {
                                            local_288 = diag_system[1];
                                          }
                                          local_280 = local_288;
                                        }
                                        else {
                                          if (weight <= 0.0) {
                                            local_250 = -weight;
                                          }
                                          else {
                                            local_250 = weight;
                                          }
                                          if (diag_system[0] <= 0.0) {
                                            local_260 = -diag_system[0];
                                          }
                                          else {
                                            local_260 = diag_system[0];
                                          }
                                          if (local_250 <= local_260) {
                                            if (diag_system[0] <= 0.0) {
                                              local_278 = -diag_system[0];
                                            }
                                            else {
                                              local_278 = diag_system[0];
                                            }
                                            local_270 = local_278;
                                          }
                                          else {
                                            if (weight <= 0.0) {
                                              local_268 = -weight;
                                            }
                                            else {
                                              local_268 = weight;
                                            }
                                            local_270 = local_268;
                                          }
                                          local_280 = local_270;
                                        }
                                        *(REF_DBL *)((long)__ptr + (long)(i + dir * 5) * 8) =
                                             local_280;
                                      }
                                    }
                                  }
                                  for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                    if (((-1 < dir) && (dir < pRVar1->max)) &&
                                       (-1 < pRVar1->global[dir])) {
                                      scalar[dir] = prim_dual[iVar2 + 4 + ldim * dir];
                                    }
                                  }
                                  metric_local._4_4_ =
                                       ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
                                  if (metric_local._4_4_ == 0) {
                                    for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
                                      for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                        if (((-1 < dir) && (dir < pRVar1->max)) &&
                                           (-1 < pRVar1->global[dir])) {
                                          scalar_00[dir] = prim_dual[local_68 + 1 + ldim * dir];
                                        }
                                      }
                                      uVar3 = ref_recon_gradient(ref_grid,scalar_00,grad_00,
                                                                 reconstruction);
                                      if (uVar3 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                               ,0xaed,"ref_metric_belme_gu",(ulong)uVar3,"grad_u");
                                        return uVar3;
                                      }
                                      for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                        if (((-1 < dir) && (dir < pRVar1->max)) &&
                                           (-1 < pRVar1->global[dir])) {
                                          *(double *)
                                           ((long)__ptr_00 + (long)(local_68 * 3 + dir * 9) * 8) =
                                               grad_00[(long)(dir * 3) + 1] *
                                               grad[(long)(dir * 3) + 2] +
                                               -(grad_00[(long)(dir * 3) + 2] *
                                                grad[(long)(dir * 3) + 1]);
                                          *(double *)
                                           ((long)__ptr_00 + (long)(local_68 * 3 + dir * 9) * 8 + 8)
                                               = grad_00[(long)(dir * 3) + 2] * grad[dir * 3] +
                                                 -(grad_00[dir * 3] * grad[(long)(dir * 3) + 2]);
                                          *(double *)
                                           ((long)__ptr_00 +
                                           (long)(local_68 * 3 + dir * 9) * 8 + 0x10) =
                                               grad_00[dir * 3] * grad[(long)(dir * 3) + 1] +
                                               -(grad_00[(long)(dir * 3) + 1] * grad[dir * 3]);
                                        }
                                      }
                                    }
                                    for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                      if (((-1 < dir) && (dir < pRVar1->max)) &&
                                         (-1 < pRVar1->global[dir])) {
                                        scalar_00[dir] = prim_dual[ldim * dir + 1];
                                      }
                                    }
                                    metric_local._4_4_ =
                                         ref_recon_hessian(ref_grid,scalar_00,hessian_00,
                                                           reconstruction);
                                    if (metric_local._4_4_ == 0) {
                                      for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                        if (((-1 < dir) && (dir < pRVar1->max)) &&
                                           (-1 < pRVar1->global[dir])) {
                                          if (prim_dual[ldim * dir + 1] <= 0.0) {
                                            local_290 = -prim_dual[ldim * dir + 1];
                                          }
                                          else {
                                            local_290 = prim_dual[ldim * dir + 1];
                                          }
                                          if (prim_dual[ldim * dir + 2] <= 0.0) {
                                            local_298 = -prim_dual[ldim * dir + 2];
                                          }
                                          else {
                                            local_298 = prim_dual[ldim * dir + 2];
                                          }
                                          if (prim_dual[ldim * dir + 3] <= 0.0) {
                                            local_2a0 = -prim_dual[ldim * dir + 3];
                                          }
                                          else {
                                            local_2a0 = prim_dual[ldim * dir + 3];
                                          }
                                          if (*(double *)((long)__ptr_00 + (long)(dir * 9 + 7) * 8)
                                              - *(double *)
                                                 ((long)__ptr_00 + (long)(dir * 9 + 5) * 8) <= 0.0)
                                          {
                                            local_2a8 = -(*(double *)
                                                           ((long)__ptr_00 + (long)(dir * 9 + 7) * 8
                                                           ) - *(double *)
                                                                ((long)__ptr_00 +
                                                                (long)(dir * 9 + 5) * 8));
                                          }
                                          else {
                                            local_2a8 = *(double *)
                                                         ((long)__ptr_00 + (long)(dir * 9 + 7) * 8)
                                                        - *(double *)
                                                           ((long)__ptr_00 + (long)(dir * 9 + 5) * 8
                                                           );
                                          }
                                          gamma = local_2a8 * 1.6666666666666667 +
                                                  (local_2a0 * 2.0 +
                                                  local_290 * 20.0 + local_298 * 2.0) *
                                                  *(double *)((long)__ptr + (long)(dir * 5 + 4) * 8)
                                                  + *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 3) * 8) * 2.0 +
                                                    *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 2) * 8) * 2.0 +
                                                    *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 1) * 8) * 20.0
                                                    + 0.0;
                                          mu = (t * prim_dual[ldim * dir + 4]) /
                                               prim_dual[ldim * dir];
                                          uVar3 = viscosity_law(mu,reference_temp,&pr);
                                          if (uVar3 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb08,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "sutherlands");
                                            return uVar3;
                                          }
                                          if (iVar2 == 6) {
                                            turb = prim_dual[ldim * dir];
                                            mu_t = prim_dual[ldim * dir + 5];
                                            uVar3 = ref_phys_mut_sa(mu_t,turb,pr / turb,
                                                                    (REF_DBL *)&ref_malloc_init_i_1)
                                            ;
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb0c,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "eddy viscosity");
                                              return uVar3;
                                            }
                                            pr = _ref_malloc_init_i_1 + pr;
                                          }
                                          gamma = (mach / re) * pr * gamma;
                                          if (gamma < 0.0) {
                                            printf("%s: %d: %s: %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb10,"ref_metric_belme_gu","negative weight u1")
                                            ;
                                            return 1;
                                          }
                                          for (nequ = 0; nequ < 6; nequ = nequ + 1) {
                                            iVar4 = nequ + dir * 6;
                                            metric[iVar4] =
                                                 gamma * hessian_00[nequ + dir * 6] + metric[iVar4];
                                          }
                                          uVar3 = ref_matrix_healthy_m(metric + dir * 6);
                                          if (uVar3 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb14,"ref_metric_belme_gu",(ulong)uVar3,"u1");
                                            return uVar3;
                                          }
                                        }
                                      }
                                      for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                        if (((-1 < dir) && (dir < pRVar1->max)) &&
                                           (-1 < pRVar1->global[dir])) {
                                          scalar_00[dir] = prim_dual[ldim * dir + 2];
                                        }
                                      }
                                      metric_local._4_4_ =
                                           ref_recon_hessian(ref_grid,scalar_00,hessian_00,
                                                             reconstruction);
                                      if (metric_local._4_4_ == 0) {
                                        for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                          if (((-1 < dir) && (dir < pRVar1->max)) &&
                                             (-1 < pRVar1->global[dir])) {
                                            if (prim_dual[ldim * dir + 1] <= 0.0) {
                                              local_2b0 = -prim_dual[ldim * dir + 1];
                                            }
                                            else {
                                              local_2b0 = prim_dual[ldim * dir + 1];
                                            }
                                            if (prim_dual[ldim * dir + 2] <= 0.0) {
                                              local_2b8 = -prim_dual[ldim * dir + 2];
                                            }
                                            else {
                                              local_2b8 = prim_dual[ldim * dir + 2];
                                            }
                                            if (prim_dual[ldim * dir + 3] <= 0.0) {
                                              local_2c0 = -prim_dual[ldim * dir + 3];
                                            }
                                            else {
                                              local_2c0 = prim_dual[ldim * dir + 3];
                                            }
                                            if (*(double *)
                                                 ((long)__ptr_00 + (long)(dir * 9 + 2) * 8) -
                                                *(double *)
                                                 ((long)__ptr_00 + (long)(dir * 9 + 6) * 8) <= 0.0)
                                            {
                                              local_2c8 = -(*(double *)
                                                             ((long)__ptr_00 +
                                                             (long)(dir * 9 + 2) * 8) -
                                                           *(double *)
                                                            ((long)__ptr_00 +
                                                            (long)(dir * 9 + 6) * 8));
                                            }
                                            else {
                                              local_2c8 = *(double *)
                                                           ((long)__ptr_00 + (long)(dir * 9 + 2) * 8
                                                           ) - *(double *)
                                                                ((long)__ptr_00 +
                                                                (long)(dir * 9 + 6) * 8);
                                            }
                                            gamma = local_2c8 * 1.6666666666666667 +
                                                    (local_2c0 * 2.0 +
                                                    local_2b0 * 2.0 + local_2b8 * 20.0) *
                                                    *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 4) * 8) +
                                                    *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 3) * 8) * 2.0 +
                                                    *(double *)
                                                     ((long)__ptr + (long)(dir * 5 + 2) * 8) * 20.0
                                                    + *(double *)
                                                       ((long)__ptr + (long)(dir * 5 + 1) * 8) * 2.0
                                                      + 0.0;
                                            mu = (t * prim_dual[ldim * dir + 4]) /
                                                 prim_dual[ldim * dir];
                                            uVar3 = viscosity_law(mu,reference_temp,&pr);
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb2b,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "sutherlands");
                                              return uVar3;
                                            }
                                            if (iVar2 == 6) {
                                              turb = prim_dual[ldim * dir];
                                              mu_t = prim_dual[ldim * dir + 5];
                                              uVar3 = ref_phys_mut_sa(mu_t,turb,pr / turb,
                                                                      (REF_DBL *)
                                                                      &ref_malloc_init_i_1);
                                              if (uVar3 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb2f,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "eddy viscosity");
                                                return uVar3;
                                              }
                                              pr = _ref_malloc_init_i_1 + pr;
                                            }
                                            gamma = (mach / re) * pr * gamma;
                                            if (gamma < 0.0) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb33,"ref_metric_belme_gu","negative weight u2")
                                              ;
                                              return 1;
                                            }
                                            for (nequ = 0; nequ < 6; nequ = nequ + 1) {
                                              iVar4 = nequ + dir * 6;
                                              metric[iVar4] =
                                                   gamma * hessian_00[nequ + dir * 6] +
                                                   metric[iVar4];
                                            }
                                            uVar3 = ref_matrix_healthy_m(metric + dir * 6);
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb37,"ref_metric_belme_gu",(ulong)uVar3,"u2");
                                              return uVar3;
                                            }
                                          }
                                        }
                                        for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                          if (((-1 < dir) && (dir < pRVar1->max)) &&
                                             (-1 < pRVar1->global[dir])) {
                                            scalar_00[dir] = prim_dual[ldim * dir + 3];
                                          }
                                        }
                                        metric_local._4_4_ =
                                             ref_recon_hessian(ref_grid,scalar_00,hessian_00,
                                                               reconstruction);
                                        if (metric_local._4_4_ == 0) {
                                          for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                            if (((-1 < dir) && (dir < pRVar1->max)) &&
                                               (-1 < pRVar1->global[dir])) {
                                              if (prim_dual[ldim * dir + 1] <= 0.0) {
                                                local_2d0 = -prim_dual[ldim * dir + 1];
                                              }
                                              else {
                                                local_2d0 = prim_dual[ldim * dir + 1];
                                              }
                                              if (prim_dual[ldim * dir + 2] <= 0.0) {
                                                local_2d8 = -prim_dual[ldim * dir + 2];
                                              }
                                              else {
                                                local_2d8 = prim_dual[ldim * dir + 2];
                                              }
                                              if (prim_dual[ldim * dir + 3] <= 0.0) {
                                                local_2e0 = -prim_dual[ldim * dir + 3];
                                              }
                                              else {
                                                local_2e0 = prim_dual[ldim * dir + 3];
                                              }
                                              if (*(double *)
                                                   ((long)__ptr_00 + (long)(dir * 9 + 3) * 8) -
                                                  *(double *)
                                                   ((long)__ptr_00 + (long)(dir * 9 + 1) * 8) <= 0.0
                                                 ) {
                                                local_2e8 = -(*(double *)
                                                               ((long)__ptr_00 +
                                                               (long)(dir * 9 + 3) * 8) -
                                                             *(double *)
                                                              ((long)__ptr_00 +
                                                              (long)(dir * 9 + 1) * 8));
                                              }
                                              else {
                                                local_2e8 = *(double *)
                                                             ((long)__ptr_00 +
                                                             (long)(dir * 9 + 3) * 8) -
                                                            *(double *)
                                                             ((long)__ptr_00 +
                                                             (long)(dir * 9 + 1) * 8);
                                              }
                                              gamma = local_2e8 * 1.6666666666666667 +
                                                      (local_2e0 * 20.0 +
                                                      local_2d0 * 2.0 + local_2d8 * 2.0) *
                                                      *(double *)
                                                       ((long)__ptr + (long)(dir * 5 + 4) * 8) +
                                                      *(double *)
                                                       ((long)__ptr + (long)(dir * 5 + 3) * 8) *
                                                      20.0 + *(double *)
                                                              ((long)__ptr + (long)(dir * 5 + 2) * 8
                                                              ) * 2.0 +
                                                             *(double *)
                                                              ((long)__ptr + (long)(dir * 5 + 1) * 8
                                                              ) * 2.0 + 0.0;
                                              mu = (t * prim_dual[ldim * dir + 4]) /
                                                   prim_dual[ldim * dir];
                                              uVar3 = viscosity_law(mu,reference_temp,&pr);
                                              if (uVar3 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb4e,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "sutherlands");
                                                return uVar3;
                                              }
                                              if (iVar2 == 6) {
                                                turb = prim_dual[ldim * dir];
                                                mu_t = prim_dual[ldim * dir + 5];
                                                uVar3 = ref_phys_mut_sa(mu_t,turb,pr / turb,
                                                                        (REF_DBL *)
                                                                        &ref_malloc_init_i_1);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb52,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "eddy viscosity");
                                                  return uVar3;
                                                }
                                                pr = _ref_malloc_init_i_1 + pr;
                                              }
                                              gamma = (mach / re) * pr * gamma;
                                              if (gamma < 0.0) {
                                                printf("%s: %d: %s: %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb56,"ref_metric_belme_gu","negative weight u2")
                                                ;
                                                return 1;
                                              }
                                              for (nequ = 0; nequ < 6; nequ = nequ + 1) {
                                                iVar4 = nequ + dir * 6;
                                                metric[iVar4] =
                                                     gamma * hessian_00[nequ + dir * 6] +
                                                     metric[iVar4];
                                              }
                                              uVar3 = ref_matrix_healthy_m(metric + dir * 6);
                                              if (uVar3 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb5a,"ref_metric_belme_gu",(ulong)uVar3,"u3");
                                                return uVar3;
                                              }
                                            }
                                          }
                                          for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                            if (((-1 < dir) && (dir < pRVar1->max)) &&
                                               (-1 < pRVar1->global[dir])) {
                                              mu = (t * prim_dual[ldim * dir + 4]) /
                                                   prim_dual[ldim * dir];
                                              scalar_00[dir] = mu;
                                            }
                                          }
                                          metric_local._4_4_ =
                                               ref_recon_hessian(ref_grid,scalar_00,hessian_00,
                                                                 reconstruction);
                                          if (metric_local._4_4_ == 0) {
                                            for (dir = 0; dir < pRVar1->max; dir = dir + 1) {
                                              if (((-1 < dir) && (dir < pRVar1->max)) &&
                                                 (-1 < pRVar1->global[dir])) {
                                                mu = (t * prim_dual[ldim * dir + 4]) /
                                                     prim_dual[ldim * dir];
                                                uVar3 = viscosity_law(mu,reference_temp,&pr);
                                                if (uVar3 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb64,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "sutherlands");
                                                  return uVar3;
                                                }
                                                rho = pr / (turbulent_pr * (t - 1.0));
                                                if (iVar2 == 6) {
                                                  turb = prim_dual[ldim * dir];
                                                  mu_t = prim_dual[ldim * dir + 5];
                                                  uVar3 = ref_phys_mut_sa(mu_t,turb,pr / turb,
                                                                          (REF_DBL *)
                                                                          &ref_malloc_init_i_1);
                                                  if (uVar3 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb69,"ref_metric_belme_gu",(ulong)uVar3,
                                                  "eddy viscosity");
                                                  return uVar3;
                                                  }
                                                  rho = pr / (turbulent_pr * (t - 1.0)) +
                                                        _ref_malloc_init_i_1 /
                                                        (thermal_conductivity * (t - 1.0));
                                                  pr = _ref_malloc_init_i_1 + pr;
                                                }
                                                for (nequ = 0; nequ < 6; nequ = nequ + 1) {
                                                  iVar4 = nequ + dir * 6;
                                                  metric[iVar4] =
                                                       ((mach * 18.0) / re) * rho *
                                                       *(double *)
                                                        ((long)__ptr + (long)(dir * 5 + 4) * 8) *
                                                       hessian_00[nequ + dir * 6] + metric[iVar4];
                                                }
                                              }
                                            }
                                            if (__ptr_00 != (void *)0x0) {
                                              free(__ptr_00);
                                            }
                                            if (grad_00 != (REF_DBL *)0x0) {
                                              free(grad_00);
                                            }
                                            if (hessian_00 != (REF_DBL *)0x0) {
                                              free(hessian_00);
                                            }
                                            if (scalar_00 != (REF_DBL *)0x0) {
                                              free(scalar_00);
                                            }
                                            if (__ptr != (void *)0x0) {
                                              free(__ptr);
                                            }
                                            if (grad != (REF_DBL *)0x0) {
                                              free(grad);
                                            }
                                            if (hessian != (REF_DBL *)0x0) {
                                              free(hessian);
                                            }
                                            if (scalar != (REF_DBL *)0x0) {
                                              free(scalar);
                                            }
                                            metric_local._4_4_ = 0;
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                  ,0xb61,"ref_metric_belme_gu",
                                                  (ulong)metric_local._4_4_,"hess_u");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                                 ,0xb41,"ref_metric_belme_gu",
                                                 (ulong)metric_local._4_4_,"hess_u");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                               ,0xb1e,"ref_metric_belme_gu",
                                               (ulong)metric_local._4_4_,"hess_u");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                             ,0xafb,"ref_metric_belme_gu",(ulong)metric_local._4_4_,
                                             "hess_u");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                           ,0xae6,"ref_metric_belme_gu",(ulong)metric_local._4_4_,
                                           "grad_u");
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gu(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i, dir;
  REF_INT nequ;
  REF_DBL *lam, *hess_lam, *grad_lam, *sr_lam, *u, *hess_u, *grad_u;
  REF_DBL *omega;
  REF_DBL u1, u2, u3;
  REF_DBL w1, w2, w3;
  REF_DBL diag_system[12];
  REF_DBL weight;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_lam, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sr_lam, 5 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(u, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_u, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_u, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(omega, 9 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_hessian(ref_grid, lam, hess_lam, reconstruction), "hess_lam");
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_diag_m(&(hess_lam[6 * node]), diag_system), "decomp");
      sr_lam[var + 5 * node] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                                       ABS(ref_matrix_eig(diag_system, 1))),
                                   ABS(ref_matrix_eig(diag_system, 2)));
    }
  } /* SR MAX (eig, min(1e-30*max(det^-1/3)) for all lambda of var */

  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction), "grad_u");

  for (dir = 0; dir < 3; dir++) {
    var = 1 + dir;
    each_ref_node_valid_node(ref_node, node) {
      u[node] = prim_dual[var + 0 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, u, grad_u, reconstruction), "grad_u");
    each_ref_node_valid_node(ref_node, node) {
      ref_math_cross_product(&(grad_u[3 * node]), &(grad_lam[3 * node]),
                             &(omega[3 * dir + 9 * node]));
    }
  }

  var = 1;
  w1 = 20.0;
  w2 = 2.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + 0 * nequ + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[1 + 2 * 3 + 9 * node] - omega[2 + 1 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u1");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u1");
  }

  var = 2;
  w1 = 2.0;
  w2 = 20.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[2 + 0 * 3 + 9 * node] - omega[0 + 2 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u2");
  }

  var = 3;
  w1 = 2.0;
  w2 = 2.0;
  w3 = 20.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[0 + 1 * 3 + 9 * node] - omega[1 + 0 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u3");
  }

  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    u[node] = t;
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += 18.0 * mach / re * thermal_conductivity *
                              sr_lam[4 + 5 * node] * hess_u[i + 6 * node];
    }
  }

  ref_free(omega);
  ref_free(grad_u);
  ref_free(hess_u);
  ref_free(u);
  ref_free(sr_lam);
  ref_free(grad_lam);
  ref_free(hess_lam);
  ref_free(lam);

  return REF_SUCCESS;
}